

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O2

bool __thiscall BamTools::RuleParser::readToken(RuleParser *this,RuleToken *token)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  
  skipSpaces(this);
  pcVar1 = this->m_current;
  pcVar2 = this->m_end;
  if (pcVar1 == pcVar2) {
LAB_0016fd3e:
    return pcVar1 != pcVar2;
  }
  (token->Value)._M_string_length = 0;
  *(token->Value)._M_dataplus._M_p = '\0';
  cVar6 = '\x01';
  bVar4 = false;
LAB_0016fc5e:
  bVar5 = true;
switchD_0016fca1_caseD_20:
  do {
    if ((cVar6 == '\0') || (!bVar5)) goto LAB_0016fd3e;
    pcVar3 = this->m_current;
    cVar6 = '\0';
    bVar5 = true;
  } while (pcVar3 == this->m_end);
  this->m_current = pcVar3 + 1;
  cVar6 = *pcVar3;
  bVar5 = false;
  switch(cVar6) {
  case ' ':
    goto switchD_0016fca1_caseD_20;
  case '!':
    token->Type = NOT_OPERATOR;
    break;
  case '\"':
  case '#':
  case '$':
  case '%':
  case '\'':
switchD_0016fca1_caseD_22:
    token->Type = OPERAND;
    std::__cxx11::string::append((ulong)&token->Value,'\x01');
    bVar5 = true;
    bVar4 = true;
    goto switchD_0016fca1_caseD_20;
  case '&':
    if (!bVar4) {
      token->Type = AND_OPERATOR;
      break;
    }
LAB_0016fd1a:
    this->m_current = pcVar3;
    goto LAB_0016fd34;
  case '(':
    token->Type = LEFT_PARENTHESIS;
    break;
  case ')':
    if (bVar4) goto LAB_0016fd1a;
    token->Type = RIGHT_PARENTHESIS;
    break;
  default:
    if (cVar6 == '\0') goto LAB_0016fc5e;
    if (cVar6 != '|') goto switchD_0016fca1_caseD_22;
    if (bVar4) goto LAB_0016fd1a;
    token->Type = OR_OPERATOR;
  }
  std::__cxx11::string::append((ulong)&token->Value,'\x01');
LAB_0016fd34:
  cVar6 = '\x01';
  bVar5 = false;
  goto switchD_0016fca1_caseD_20;
}

Assistant:

inline bool RuleParser::readToken(RuleToken& token)
{

    // skip any preceding whitespace
    skipSpaces();
    if (m_current == m_end) return false;

    // clear out prior token value
    token.Value.clear();

    // read chars while still in token
    char c = 1;
    bool keepReading = true;
    bool inOperandString = false;
    while (keepReading && (c != 0)) {

        // get next char
        c = getNextChar();
        switch (c) {

            // current char is '('
            case (LEFT_PARENTHESIS_CHAR):
                token.Type = RuleToken::LEFT_PARENTHESIS;
                token.Value.append(1, LEFT_PARENTHESIS_CHAR);
                keepReading = false;
                break;

            // current char is ')'
            case (RIGHT_PARENTHESIS_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::RIGHT_PARENTHESIS;
                    token.Value.append(1, RIGHT_PARENTHESIS_CHAR);
                }
                keepReading = false;
                break;

            // current char is '&'
            case (AND_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::AND_OPERATOR;
                    token.Value.append(1, AND_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '|'
            case (OR_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::OR_OPERATOR;
                    token.Value.append(1, OR_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '!'
            case (NOT_OPERATOR_CHAR):
                token.Type = RuleToken::NOT_OPERATOR;
                token.Value.append(1, NOT_OPERATOR_CHAR);
                keepReading = false;
                break;

            // current char is ' '
            case (SPACE_CHAR):
                keepReading = false;
                break;

            // current char is a true value token
            default:
                if (c != 0) {
                    token.Type = RuleToken::OPERAND;
                    token.Value.append(1, c);
                    inOperandString = true;
                    keepReading = true;
                }
        }
    }

    return true;
}